

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineSamplerTests.cpp
# Opt level: O1

vector<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_> * __thiscall
vkt::pipeline::anon_unknown_0::SamplerTest::createVertices
          (vector<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_>
           *__return_storage_ptr__,SamplerTest *this)

{
  pointer pVVar1;
  long lVar2;
  ulong uVar3;
  long lVar4;
  float local_18 [4];
  
  createTestQuadMosaic(__return_storage_ptr__,this->m_imageViewType);
  pVVar1 = (__return_storage_ptr__->
           super__Vector_base<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_>
           )._M_impl.super__Vector_impl_data._M_start;
  lVar2 = (long)(__return_storage_ptr__->
                super__Vector_base<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)pVVar1;
  if (lVar2 != 0) {
    uVar3 = 0;
    do {
      local_18[0] = 0.002;
      local_18[1] = 0.002;
      local_18[2] = 0.002;
      local_18[3] = 0.0;
      lVar4 = 0;
      do {
        pVVar1[uVar3].texCoord.m_data[lVar4] =
             local_18[lVar4] + pVVar1[uVar3].texCoord.m_data[lVar4];
        lVar4 = lVar4 + 1;
      } while (lVar4 != 4);
      uVar3 = (ulong)((int)uVar3 + 1);
    } while (uVar3 < (ulong)(lVar2 >> 5));
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Vertex4Tex4> SamplerTest::createVertices (void) const
{
	std::vector<Vertex4Tex4> vertices = createTestQuadMosaic(m_imageViewType);
	// Adjust texture coordinate to avoid doing NEAREST filtering exactly on texel boundaries.
	// TODO: Would be nice to base this on number of texels and subtexel precision. But this
	// seems to work.
	for (unsigned int i = 0; i < vertices.size(); ++i) {
		vertices[i].texCoord += tcu::Vec4(0.002f, 0.002f, 0.002f, 0.0f);
	}
	return vertices;
}